

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

IdleDecommitSignal __thiscall Memory::HeapInfo::LeaveIdleDecommit(HeapInfo *this,bool allowTimer)

{
  IdleDecommitSignal IVar1;
  IdleDecommitSignal IVar2;
  
  IVar1 = IdleDecommitPageAllocator::LeaveIdleDecommit
                    (&(this->recyclerPageAllocator).super_IdleDecommitPageAllocator,allowTimer);
  IVar2 = IdleDecommitPageAllocator::LeaveIdleDecommit
                    (&(this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator,
                     allowTimer);
  if ((int)IVar2 < (int)IVar1) {
    IVar2 = IVar1;
  }
  IVar1 = IdleDecommitPageAllocator::LeaveIdleDecommit
                    (&(this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator,
                     allowTimer);
  if ((int)IVar1 < (int)IVar2) {
    IVar1 = IVar2;
  }
  IVar2 = IdleDecommitPageAllocator::LeaveIdleDecommit(this->recyclerLeafPageAllocator,allowTimer);
  if ((int)IVar2 < (int)IVar1) {
    IVar2 = IVar1;
  }
  if ((int)IVar2 < 1) {
    IVar2 = IdleDecommitSignal_None;
  }
  return IVar2;
}

Assistant:

IdleDecommitSignal
HeapInfo::LeaveIdleDecommit(bool allowTimer)
{
    IdleDecommitSignal idleDecommitSignal = IdleDecommitSignal_None;
    ForEachPageAllocator([&idleDecommitSignal, allowTimer](IdleDecommitPageAllocator * pageAlloc)
    {
        IdleDecommitSignal signal = pageAlloc->LeaveIdleDecommit(allowTimer);
        idleDecommitSignal = max(idleDecommitSignal, signal);
    });
    return idleDecommitSignal;
}